

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fftplt(fitsfile **fptr,char *filename,char *tempname,int *status)

{
  int iVar1;
  
  *fptr = (fitsfile *)0x0;
  if (0 < *status) {
    return *status;
  }
  iVar1 = ffinit(fptr,filename,status);
  if (iVar1 == 0) {
    ffoptplt(*fptr,tempname,status);
  }
  return *status;
}

Assistant:

int fftplt(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *filename, /* I - name of file to create              */
           const char *tempname, /* I - name of template file               */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file  based on a template file.
  Uses C fopen and fgets functions.
*/
{
    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if ( ffinit(fptr, filename, status) )  /* create empty file */
        return(*status);

    ffoptplt(*fptr, tempname, status);  /* open and use template */

    return(*status);
}